

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.cc
# Opt level: O0

double lf::fe::Legendre(uint n,double x,double t)

{
  ulong uVar1;
  int iVar2;
  double dVar3;
  double Pip1;
  double dStack_38;
  uint i;
  double Pi;
  double Pim1;
  double t_local;
  double x_local;
  double dStack_10;
  uint n_local;
  
  if (n == 0) {
    dStack_10 = 1.0;
  }
  else if (n == 1) {
    dStack_10 = x + x + -t;
  }
  else {
    Pi = 1.0;
    dStack_38 = x + x + -t;
    for (Pip1._4_4_ = 2; Pip1._4_4_ <= n; Pip1._4_4_ = Pip1._4_4_ + 1) {
      iVar2 = Pip1._4_4_ * 2;
      uVar1 = (ulong)Pip1._4_4_;
      dVar3 = (((double)(Pip1._4_4_ - 1) * t * t) / (double)uVar1) * Pi;
      Pi = dStack_38;
      dStack_38 = (((double)(iVar2 - 1) * ((x + x) - t)) / (double)uVar1) * dStack_38 + -dVar3;
    }
    dStack_10 = dStack_38;
  }
  return dStack_10;
}

Assistant:

double Legendre(unsigned n, double x, double t) {
  if (n == 0) {
    return 1;
  }
  if (n == 1) {
    return 2 * x - t;
  }
  double Pim1 = 1;
  double Pi = 2 * x - t;
  for (unsigned i = 2; i <= n; ++i) {
    const double Pip1 =
        (2 * i - 1) * (2 * x - t) / i * Pi - (i - 1) * t * t / i * Pim1;
    Pim1 = Pi;
    Pi = Pip1;
  }
  return Pi;
}